

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O0

void __thiscall
ValidateFootprint::ReadFirstFootprintLine(ValidateFootprint *this,OASIS_FLOAT *totalProbability)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  OASIS_FLOAT *totalProbability_local;
  ValidateFootprint *this_local;
  
  pcVar3 = fgets((this->super_Validate).line_,0x1000,_stdin);
  if (pcVar3 != (char *)0x0) {
    iVar1 = ScanLine(this);
    if (iVar1 == 4) {
      iVar1 = Validate::CheckIDDoesNotExceedMaxLimit
                        (&this->super_Validate,this->eveIDName_,this->initialEveID_);
      (this->fr_).event_id = iVar1;
      uVar2 = Validate::CheckIDDoesNotExceedMaxLimit
                        (&this->super_Validate,this->areaperilIDName_,this->initialAreaperilID_);
      (this->fr_).super_EventRow.areaperil_id = uVar2;
      if ((this->validationCheck_ & 1U) == 0) {
        (**this->_vptr_ValidateFootprint)();
        return;
      }
      StoreLine(this);
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->intensityBinIDs_,&(this->fr_).super_EventRow.intensity_bin_id);
      *totalProbability = (this->fr_).super_EventRow.probability;
      SetMaximumIntensityBinIndex(this);
      return;
    }
    fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
            (ulong)(uint)(this->super_Validate).lineno_,&this->super_Validate);
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  fprintf(_stderr,"ERROR: Empty file\n");
  Validate::PrintErrorMessage(&this->super_Validate);
  return;
}

Assistant:

void ValidateFootprint::ReadFirstFootprintLine(OASIS_FLOAT &totalProbability) {
/* After skipping header, first line of footprint csv file is read primarily to
 * establish initial event ID. */

  if (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = CheckIDDoesNotExceedMaxLimit(eveIDName_, initialEveID_);
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      // If areaperil ID is of data type unsigned long long, it is not possible
      // to check for overflow
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = CheckIDDoesNotExceedMaxLimit(areaperilIDName_,
						      initialAreaperilID_);
#endif

      // In the case when there are no validation checks to perform, the
      // initial previous event ID must still be set and line number
      // incremented. In this case, total probability is not used.
      if (!validationCheck_) {

        SetPreviousEventID();

	return;

      }

      StoreLine();
      intensityBinIDs_.push_back(fr_.intensity_bin_id);
      totalProbability = fr_.probability;

      SetMaximumIntensityBinIndex();

      return;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  fprintf(stderr, "ERROR: Empty file\n");
  PrintErrorMessage();

}